

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

void __thiscall
spirv_cross::ParsedIR::make_constant_null
          (ParsedIR *this,uint32_t id,uint32_t type,bool add_to_typed_id_set)

{
  bool bVar1;
  ID IVar2;
  uint32_t uVar3;
  uint uVar4;
  SPIRType *constant_type_;
  SPIRConstant *pSVar5;
  undefined7 in_register_00000009;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  bool local_89;
  uint32_t type_local;
  undefined4 local_84;
  ulong local_80;
  ID local_78;
  uint local_74;
  uint *local_70;
  SmallVector<unsigned_int,_8UL> elements;
  
  uVar7 = (ulong)id;
  type_local = type;
  if ((this->ids).super_VectorView<spirv_cross::Variant>.buffer_size <= uVar7) {
    __assert_fail("id < ids.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                  ,0x40b,"void spirv_cross::ParsedIR::make_constant_null(uint32_t, uint32_t, bool)")
    ;
  }
  constant_type_ = get<spirv_cross::SPIRType>(this,type);
  if (constant_type_->pointer == true) {
LAB_002f38e8:
    if (add_to_typed_id_set) {
      add_typed_id(this,TypeConstant,(ID)id);
    }
    pSVar5 = variant_set<spirv_cross::SPIRConstant,unsigned_int&>
                       ((this->ids).super_VectorView<spirv_cross::Variant>.ptr + uVar7,&type_local);
    (pSVar5->super_IVariant).self.id = id;
    SPIRConstant::make_null(pSVar5,constant_type_);
  }
  else {
    local_84 = (undefined4)CONCAT71(in_register_00000009,add_to_typed_id_set);
    local_80 = uVar7;
    if ((constant_type_->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      sVar8 = (constant_type_->member_types).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
      if (sVar8 == 0) goto LAB_002f38e8;
      local_78.id = id;
      uVar3 = increase_bound_by(this,(uint32_t)sVar8);
      SmallVector<unsigned_int,_8UL>::SmallVector
                (&elements,
                 (constant_type_->member_types).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size);
      for (uVar4 = 0; IVar2.id = local_78.id, uVar7 = (ulong)uVar4,
          uVar7 < (constant_type_->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
          uVar4 = uVar4 + 1) {
        make_constant_null(this,uVar3 + uVar4,
                           (constant_type_->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar7]
                           .id,add_to_typed_id_set);
        elements.super_VectorView<unsigned_int>.ptr[uVar7] = uVar3 + uVar4;
      }
      if ((char)local_84 != '\0') {
        add_typed_id(this,TypeConstant,local_78);
      }
      local_70 = elements.super_VectorView<unsigned_int>.ptr;
      local_74 = (uint)elements.super_VectorView<unsigned_int>.buffer_size;
      local_89 = false;
      pSVar5 = variant_set<spirv_cross::SPIRConstant,unsigned_int&,unsigned_int*,unsigned_int,bool>
                         ((this->ids).super_VectorView<spirv_cross::Variant>.ptr + local_80,
                          &type_local,&local_70,&local_74,&local_89);
      (pSVar5->super_IVariant).self.id = IVar2.id;
    }
    else {
      if ((constant_type_->parent_type).id == 0) {
        __assert_fail("constant_type.parent_type",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                      ,0x419,
                      "void spirv_cross::ParsedIR::make_constant_null(uint32_t, uint32_t, bool)");
      }
      uVar3 = increase_bound_by(this,1);
      make_constant_null(this,uVar3,(constant_type_->parent_type).id,add_to_typed_id_set);
      bVar1 = (constant_type_->array_size_literal).super_VectorView<bool>.ptr
              [(constant_type_->array_size_literal).super_VectorView<bool>.buffer_size - 1];
      if (bVar1 == true) {
        sVar8 = (size_t)(constant_type_->array).super_VectorView<unsigned_int>.ptr
                        [(constant_type_->array).super_VectorView<unsigned_int>.buffer_size - 1];
      }
      else {
        sVar8 = 1;
      }
      SmallVector<unsigned_int,_8UL>::SmallVector(&elements,sVar8);
      uVar7 = local_80;
      for (sVar6 = 0; sVar8 != sVar6; sVar6 = sVar6 + 1) {
        elements.super_VectorView<unsigned_int>.ptr[sVar6] = uVar3;
      }
      if ((char)local_84 != '\0') {
        add_typed_id(this,TypeConstant,(ID)id);
      }
      local_74 = (uint)elements.super_VectorView<unsigned_int>.buffer_size;
      local_89 = false;
      local_70 = elements.super_VectorView<unsigned_int>.ptr;
      pSVar5 = variant_set<spirv_cross::SPIRConstant,unsigned_int&,unsigned_int*,unsigned_int,bool>
                         ((this->ids).super_VectorView<spirv_cross::Variant>.ptr + uVar7,&type_local
                          ,&local_70,&local_74,&local_89);
      (pSVar5->super_IVariant).self.id = id;
      pSVar5->is_null_array_specialized_length = (bool)(bVar1 ^ 1);
    }
    SmallVector<unsigned_int,_8UL>::~SmallVector(&elements);
  }
  return;
}

Assistant:

void ParsedIR::make_constant_null(uint32_t id, uint32_t type, bool add_to_typed_id_set)
{
	assert(id < ids.size());

	auto &constant_type = get<SPIRType>(type);

	if (constant_type.pointer)
	{
		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto &constant = variant_set<SPIRConstant>(ids[id], type);
		constant.self = id;
		constant.make_null(constant_type);
	}
	else if (!constant_type.array.empty())
	{
		assert(constant_type.parent_type);
		uint32_t parent_id = increase_bound_by(1);
		make_constant_null(parent_id, constant_type.parent_type, add_to_typed_id_set);

		// The array size of OpConstantNull can be either literal or specialization constant.
		// In the latter case, we cannot take the value as-is, as it can be changed to anything.
		// Rather, we assume it to be *one* for the sake of initializer.
		bool is_literal_array_size = constant_type.array_size_literal.back();
		uint32_t count = is_literal_array_size ? constant_type.array.back() : 1;

		SmallVector<uint32_t> elements(count);
		for (uint32_t i = 0; i < count; i++)
			elements[i] = parent_id;

		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto& constant = variant_set<SPIRConstant>(ids[id], type, elements.data(), uint32_t(elements.size()), false);
		constant.self = id;
		constant.is_null_array_specialized_length = !is_literal_array_size;
	}
	else if (!constant_type.member_types.empty())
	{
		uint32_t member_ids = increase_bound_by(uint32_t(constant_type.member_types.size()));
		SmallVector<uint32_t> elements(constant_type.member_types.size());
		for (uint32_t i = 0; i < constant_type.member_types.size(); i++)
		{
			make_constant_null(member_ids + i, constant_type.member_types[i], add_to_typed_id_set);
			elements[i] = member_ids + i;
		}

		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		variant_set<SPIRConstant>(ids[id], type, elements.data(), uint32_t(elements.size()), false).self = id;
	}
	else
	{
		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto &constant = variant_set<SPIRConstant>(ids[id], type);
		constant.self = id;
		constant.make_null(constant_type);
	}
}